

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_refs.h
# Opt level: O1

bool dukglue::detail::RefManager::find_and_push_native_object(duk_context *ctx,void *obj_ptr)

{
  ulong uVar1;
  RefMap *pRVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  
  pRVar2 = get_ref_map(ctx);
  uVar1 = (pRVar2->_M_h)._M_bucket_count;
  uVar3 = (ulong)obj_ptr % uVar1;
  p_Var4 = (pRVar2->_M_h)._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var4->_M_nxt, p_Var5 = p_Var4,
     p_Var4->_M_nxt[1]._M_nxt != (_Hash_node_base *)obj_ptr)) {
    while (p_Var4 = p_Var6, p_Var6 = p_Var4->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, p_Var6[1]._M_nxt == (_Hash_node_base *)obj_ptr)) goto LAB_00118df0;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_00118df0:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var5->_M_nxt;
  }
  if (p_Var6 != (_Hash_node_base *)0x0) {
    push_ref_array(ctx);
    duk_get_prop_index(ctx,-1,*(duk_uarridx_t *)&p_Var6[2]._M_nxt);
    duk_remove(ctx,-2);
  }
  return p_Var6 != (_Hash_node_base *)0x0;
}

Assistant:

static bool find_and_push_native_object(duk_context* ctx, void* obj_ptr)
			{
				RefMap* ref_map = get_ref_map(ctx);

				const auto it = ref_map->find(obj_ptr);

				if (it == ref_map->end()) {
					return false;
				} else {
					push_ref_array(ctx);
					duk_get_prop_index(ctx, -1, it->second);
					duk_remove(ctx, -2);
					return true;
				}
			}